

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

int T_strcmp<char>(char *left,char *right)

{
  char cVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = left[lVar2];
    if (cVar1 != right[lVar2]) {
      return (int)cVar1 - (int)right[lVar2];
    }
    if (cVar1 == '\0') break;
    lVar2 = lVar2 + 1;
  }
  return 0;
}

Assistant:

static int T_strcmp(const char_T *left, const char_T *right)
{
    for ( ;; ) {
        if (*left != *right)
            return *left - *right;
        if (*left == 0)
            return 0;

        ++left;
        ++right;
    }
}